

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O1

void * v2i_crld(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s1;
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  CONF_VALUE *cnf;
  size_t sVar3;
  ASN1_VALUE *pAVar4;
  ASN1_VALUE *pAVar5;
  OPENSSL_STACK *sk_00;
  CONF_VALUE *cnf_00;
  stack_st_GENERAL_NAME *psVar6;
  size_t sVar7;
  int iVar8;
  bool bVar9;
  int local_74;
  OPENSSL_STACK *local_70;
  GENERAL_NAME *local_68;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
    local_70 = (OPENSSL_STACK *)0x0;
    local_68 = (GENERAL_NAME *)0x0;
  }
  else {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar2 == 0) {
      local_70 = (OPENSSL_STACK *)0x0;
      local_68 = (GENERAL_NAME *)0x0;
      bVar9 = false;
    }
    else {
      sVar2 = 0;
      local_68 = (GENERAL_NAME *)0x0;
      local_70 = (OPENSSL_STACK *)0x0;
      do {
        cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar2);
        if (cnf->value == (char *)0x0) {
          sk_00 = (OPENSSL_STACK *)X509V3_get_section((X509V3_CTX *)ctx,cnf->name);
          local_74 = 2;
          if (sk_00 == (OPENSSL_STACK *)0x0) {
            bVar9 = false;
          }
          else {
            pAVar4 = ASN1_item_new((ASN1_ITEM *)&DIST_POINT_it);
            if (pAVar4 == (ASN1_VALUE *)0x0) {
LAB_0023e8d5:
              ASN1_item_free(pAVar4,(ASN1_ITEM *)&DIST_POINT_it);
              pAVar4 = (ASN1_VALUE *)0x0;
            }
            else {
              sVar3 = OPENSSL_sk_num(sk_00);
              if (sVar3 != 0) {
                sVar3 = 0;
                do {
                  cnf_00 = (CONF_VALUE *)OPENSSL_sk_value(sk_00,sVar3);
                  iVar1 = set_dist_point_name((DIST_POINT_NAME **)pAVar4,ctx,cnf_00);
                  iVar8 = 5;
                  if ((iVar1 < 1) && (iVar8 = 2, -1 < iVar1)) {
                    __s1 = cnf_00->name;
                    iVar1 = strcmp(__s1,"reasons");
                    if (iVar1 == 0) {
                      iVar1 = set_reasons((ASN1_BIT_STRING **)(pAVar4 + 8),cnf_00->value);
                      if (iVar1 == 0) goto LAB_0023e89f;
                    }
                    else {
                      iVar1 = strcmp(__s1,"CRLissuer");
                      if (iVar1 == 0) {
                        GENERAL_NAMES_free(*(GENERAL_NAMES **)(pAVar4 + 0x10));
                        psVar6 = gnames_from_sectname(ctx,cnf_00->value);
                        *(stack_st_GENERAL_NAME **)(pAVar4 + 0x10) = psVar6;
                        if (psVar6 == (stack_st_GENERAL_NAME *)0x0) goto LAB_0023e89f;
                      }
                    }
                    iVar8 = 0;
                  }
LAB_0023e89f:
                  if ((iVar8 != 5) && (iVar8 != 0)) goto LAB_0023e8c1;
                  sVar3 = sVar3 + 1;
                  sVar7 = OPENSSL_sk_num(sk_00);
                } while (sVar3 < sVar7);
                iVar8 = 3;
LAB_0023e8c1:
                if (iVar8 == 2) goto LAB_0023e8d5;
              }
            }
            bVar9 = false;
            if (pAVar4 != (ASN1_VALUE *)0x0) {
              sVar3 = OPENSSL_sk_push(sk,pAVar4);
              bVar9 = true;
              if (sVar3 == 0) {
                ASN1_item_free(pAVar4,(ASN1_ITEM *)&DIST_POINT_it);
                goto LAB_0023e946;
              }
              local_74 = 0;
            }
          }
        }
        else {
          local_68 = v2i_GENERAL_NAME((X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,cnf);
          local_74 = 2;
          if (local_68 == (GENERAL_NAME *)0x0) {
            local_68 = (GENERAL_NAME *)0x0;
          }
          else {
            local_70 = (OPENSSL_STACK *)GENERAL_NAMES_new();
            if (local_70 == (OPENSSL_STACK *)0x0) {
              local_70 = (OPENSSL_STACK *)0x0;
            }
            else {
              sVar3 = OPENSSL_sk_push(local_70,local_68);
              if (sVar3 != 0) {
                pAVar4 = ASN1_item_new((ASN1_ITEM *)&DIST_POINT_it);
                if (pAVar4 == (ASN1_VALUE *)0x0) {
LAB_0023e962:
                  bVar9 = false;
                }
                else {
                  sVar3 = OPENSSL_sk_push(sk,pAVar4);
                  if (sVar3 == 0) {
                    ASN1_item_free(pAVar4,(ASN1_ITEM *)&DIST_POINT_it);
                    goto LAB_0023e962;
                  }
                  pAVar5 = ASN1_item_new((ASN1_ITEM *)&DIST_POINT_NAME_it);
                  *(ASN1_VALUE **)pAVar4 = pAVar5;
                  if (pAVar5 == (ASN1_VALUE *)0x0) goto LAB_0023e962;
                  *(OPENSSL_STACK **)(pAVar5 + 8) = local_70;
                  **(undefined4 **)pAVar4 = 0;
                  bVar9 = true;
                  local_70 = (OPENSSL_STACK *)0x0;
                  local_74 = 0;
                }
                local_68 = (GENERAL_NAME *)0x0;
                goto LAB_0023e969;
              }
            }
          }
LAB_0023e946:
          local_74 = 2;
          bVar9 = false;
        }
LAB_0023e969:
        if (!bVar9) goto LAB_0023e989;
        sVar2 = sVar2 + 1;
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      } while (sVar2 < sVar3);
      local_74 = 3;
LAB_0023e989:
      bVar9 = local_74 == 2;
    }
    if (!bVar9) {
      return sk;
    }
  }
  GENERAL_NAME_free(local_68);
  GENERAL_NAMES_free((GENERAL_NAMES *)local_70);
  OPENSSL_sk_pop_free_ex(sk,sk_DIST_POINT_call_free_func,DIST_POINT_free);
  return (void *)0x0;
}

Assistant:

static void *v2i_crld(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                      const STACK_OF(CONF_VALUE) *nval) {
  STACK_OF(DIST_POINT) *crld = NULL;
  GENERAL_NAMES *gens = NULL;
  GENERAL_NAME *gen = NULL;
  if (!(crld = sk_DIST_POINT_new_null())) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    DIST_POINT *point;
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (!cnf->value) {
      const STACK_OF(CONF_VALUE) *dpsect = X509V3_get_section(ctx, cnf->name);
      if (!dpsect) {
        goto err;
      }
      point = crldp_from_section(ctx, dpsect);
      if (!point) {
        goto err;
      }
      if (!sk_DIST_POINT_push(crld, point)) {
        DIST_POINT_free(point);
        goto err;
      }
    } else {
      if (!(gen = v2i_GENERAL_NAME(method, ctx, cnf))) {
        goto err;
      }
      if (!(gens = GENERAL_NAMES_new())) {
        goto err;
      }
      if (!sk_GENERAL_NAME_push(gens, gen)) {
        goto err;
      }
      gen = NULL;
      if (!(point = DIST_POINT_new())) {
        goto err;
      }
      if (!sk_DIST_POINT_push(crld, point)) {
        DIST_POINT_free(point);
        goto err;
      }
      if (!(point->distpoint = DIST_POINT_NAME_new())) {
        goto err;
      }
      point->distpoint->name.fullname = gens;
      point->distpoint->type = 0;
      gens = NULL;
    }
  }
  return crld;

err:
  GENERAL_NAME_free(gen);
  GENERAL_NAMES_free(gens);
  sk_DIST_POINT_pop_free(crld, DIST_POINT_free);
  return NULL;
}